

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.c
# Opt level: O0

_Bool player_restore_mana(player *p,wchar_t amt)

{
  short sVar1;
  wchar_t old_csp;
  wchar_t amt_local;
  player *p_local;
  
  sVar1 = p->csp;
  p->csp = p->csp + (short)amt;
  if (p->msp < p->csp) {
    p->csp = p->msp;
  }
  p->upkeep->redraw = p->upkeep->redraw | 0x80;
  msg("You feel some of your energies returning.");
  return p->csp != sVar1;
}

Assistant:

bool player_restore_mana(struct player *p, int amt) {
	int old_csp = p->csp;

	p->csp += amt;
	if (p->csp > p->msp) {
		p->csp = p->msp;
	}
	p->upkeep->redraw |= PR_MANA;

	msg("You feel some of your energies returning.");

	return p->csp != old_csp;
}